

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.h
# Opt level: O1

void __thiscall
slang::ast::SimpleSystemSubroutine::SimpleSystemSubroutine
          (SimpleSystemSubroutine *this,KnownSystemName knownNameId,SubroutineKind kind,
          size_t requiredArgs,
          vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_> *argTypes,
          Type *returnType,bool isMethod,bool isFirstArgLValue)

{
  string_view sVar1;
  
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SystemSubroutine_005e5020;
  sVar1 = parsing::toString(knownNameId);
  (this->super_SystemSubroutine).name._M_dataplus._M_p =
       (pointer)&(this->super_SystemSubroutine).name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&(this->super_SystemSubroutine).name,sVar1._M_str,sVar1._M_str + sVar1._M_len
            );
  (this->super_SystemSubroutine).kind = kind;
  (this->super_SystemSubroutine).knownNameId = knownNameId;
  (this->super_SystemSubroutine).hasOutputArgs = false;
  (this->super_SystemSubroutine).neverReturns = false;
  (this->super_SystemSubroutine).withClauseMode = None;
  (this->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SimpleSystemSubroutine_005e5088;
  std::vector<const_slang::ast::Type_*,_std::allocator<const_slang::ast::Type_*>_>::vector
            (&this->argTypes,argTypes);
  this->returnType = returnType;
  this->requiredArgs = requiredArgs;
  this->isMethod = isMethod;
  this->isFirstArgLValue = isFirstArgLValue;
  return;
}

Assistant:

SimpleSystemSubroutine(KnownSystemName knownNameId, SubroutineKind kind, size_t requiredArgs,
                           const std::vector<const Type*>& argTypes, const Type& returnType,
                           bool isMethod, bool isFirstArgLValue = false) :
        SystemSubroutine(knownNameId, kind), argTypes(argTypes), returnType(&returnType),
        requiredArgs(requiredArgs), isMethod(isMethod), isFirstArgLValue(isFirstArgLValue) {
        SLANG_ASSERT(requiredArgs <= argTypes.size());
    }